

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<std::__cxx11::string,double>::
MapAllocator<std::set<std::__cxx11::string*,google::protobuf::Map<std::__cxx11::string,double>::InnerMap::KeyCompare,google::protobuf::Map<std::__cxx11::string,double>::MapAllocator<std::__cxx11::string*>>>
::
construct<std::set<std::__cxx11::string*,google::protobuf::Map<std::__cxx11::string,double>::InnerMap::KeyCompare,google::protobuf::Map<std::__cxx11::string,double>::MapAllocator<std::__cxx11::string*>>,std::set<std::__cxx11::string*,google::protobuf::Map<std::__cxx11::string,double>::InnerMap::KeyCompare,google::protobuf::Map<std::__cxx11::string,double>::MapAllocator<std::__cxx11::string*>>>
          (MapAllocator<std::set<std::__cxx11::string*,google::protobuf::Map<std::__cxx11::string,double>::InnerMap::KeyCompare,google::protobuf::Map<std::__cxx11::string,double>::MapAllocator<std::__cxx11::string*>>>
           *this,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 *p,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
          *args)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *args_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *p_local;
  MapAllocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  *this_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::set(p,args);
  return;
}

Assistant:

void construct(NodeType* p, Args&&... args) {
      // Clang 3.6 doesn't compile static casting to void* directly. (Issue
      // #1266) According C++ standard 5.2.9/1: "The static_cast operator shall
      // not cast away constness". So first the maybe const pointer is casted to
      // const void* and after the const void* is const casted.
      new (const_cast<void*>(static_cast<const void*>(p)))
          NodeType(std::forward<Args>(args)...);
    }